

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

int units::order(unit *val)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  unit *in_RDI;
  int order;
  unit_data bd;
  unit_data local_c [3];
  
  local_c[0] = unit::base_units(in_RDI);
  iVar1 = detail::unit_data::meter(local_c);
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  iVar2 = detail::unit_data::kelvin(local_c);
  if (iVar2 < 1) {
    iVar2 = -iVar2;
  }
  iVar3 = detail::unit_data::kg(local_c);
  if (iVar3 < 1) {
    iVar3 = -iVar3;
  }
  iVar4 = detail::unit_data::count(local_c);
  if (iVar4 < 1) {
    iVar4 = -iVar4;
  }
  iVar5 = detail::unit_data::ampere(local_c);
  if (iVar5 < 1) {
    iVar5 = -iVar5;
  }
  iVar6 = detail::unit_data::second(local_c);
  if (iVar6 < 1) {
    iVar6 = -iVar6;
  }
  iVar7 = detail::unit_data::currency(local_c);
  if (iVar7 < 1) {
    iVar7 = -iVar7;
  }
  iVar8 = detail::unit_data::radian(local_c);
  if (iVar8 < 1) {
    iVar8 = -iVar8;
  }
  iVar9 = detail::unit_data::candela(local_c);
  if (iVar9 < 1) {
    iVar9 = -iVar9;
  }
  iVar10 = detail::unit_data::mole(local_c);
  if (iVar10 < 1) {
    iVar10 = -iVar10;
  }
  return iVar1 + iVar2 + iVar3 + iVar4 + iVar5 + iVar6 + iVar7 + iVar8 + iVar9 + iVar10;
}

Assistant:

static int order(const unit& val)
{
    auto bd = val.base_units();
    int order = std::labs(bd.meter()) + std::labs(bd.kelvin()) +
        std::labs(bd.kg()) + std::labs(bd.count()) + std::labs(bd.ampere()) +
        std::labs(bd.second()) + std::labs(bd.currency()) +
        std::labs(bd.radian()) + std::labs(bd.candela()) + std::labs(bd.mole());
    return order;
}